

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_25fcf1::LogisimParser::add_pin_location
          (LogisimParser *this,Position *loc,pin_id_t start,size_t count)

{
  Position PVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  mapped_type *pmVar6;
  Position PVar7;
  ulong uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  pin_id_t local_38;
  
  local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  PVar1 = (Position)loc->m_full;
  PVar7 = PVar1;
  if (count != 0) {
    do {
      local_38 = start;
      if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_50,
                   (iterator)
                   local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = start;
        local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      start = start + 1;
      count = count - 1;
    } while (count != 0);
    PVar7 = (Position)loc->m_full;
  }
  uVar2 = (this->m_context).m_pin_locs._M_h._M_bucket_count;
  uVar8 = PVar7.m_full % uVar2;
  p_Var3 = (this->m_context).m_pin_locs._M_h._M_buckets[uVar8];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var3->_M_nxt;
    p_Var5 = p_Var4[1]._M_nxt;
    do {
      if (p_Var5 == (_Hash_node_base *)PVar7.m_full) goto LAB_00171708;
      p_Var4 = p_Var4->_M_nxt;
    } while ((p_Var4 != (_Hash_node_base *)0x0) &&
            (p_Var5 = p_Var4[1]._M_nxt, (ulong)p_Var5 % uVar2 == uVar8));
  }
  pmVar6 = std::
           unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
           ::operator[](&(this->m_context).m_pin_locs,&loc->m_full);
  pmVar6->m_position = PVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pmVar6->m_pins,&local_50);
LAB_00171708:
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LogisimParser::add_pin_location(const Position &loc, pin_id_t start, size_t count) {
    LogisimConnection connection;
    connection.m_position = loc;

    for (size_t i = 0; i < count; ++i) {
       connection.m_pins.push_back(start + i);
    }

    // connect if there is already a pin in the same location
    auto res = m_context.m_pin_locs.find(loc.m_full);
    if (res != m_context.m_pin_locs.end()) {
        // XXX make_connection(connection, res->second);
    } else {
       m_context.m_pin_locs[loc.m_full] = connection;
    }
}